

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall QHashPrivate::MultiNodeChain<int>::free(MultiNodeChain<int> *this,void *__ptr)

{
  MultiNodeChain<int> *pMVar1;
  
  while (this != (MultiNodeChain<int> *)0x0) {
    pMVar1 = this->next;
    operator_delete(this,0x10);
    this = pMVar1;
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }